

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_packet.cxx
# Opt level: O0

void __thiscall xray_re::xr_packet::r_sz(xr_packet *this,string *value)

{
  size_t sVar1;
  size_t sVar2;
  uint8_t *p;
  string *value_local;
  xr_packet *this_local;
  
  sVar1 = this->m_r_pos;
  do {
    if (0xfff < this->m_r_pos) {
      if (this->m_r_pos < 0x1000) {
        std::__cxx11::string::assign<unsigned_char*,void>
                  ((string *)value,this->m_buf + sVar1,this->m_buf + this->m_r_pos);
        return;
      }
      __assert_fail("m_r_pos < sizeof(m_buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_packet.cxx"
                    ,0x5d,"void xray_re::xr_packet::r_sz(std::string &)");
    }
    sVar2 = this->m_r_pos;
    this->m_r_pos = sVar2 + 1;
  } while (this->m_buf[sVar2] != '\0');
  std::__cxx11::string::assign<unsigned_char*,void>
            ((string *)value,this->m_buf + sVar1,this->m_buf + (this->m_r_pos - 1));
  return;
}

Assistant:

void xr_packet::r_sz(std::string& value)
{
	uint8_t* p = &m_buf[m_r_pos];
	while (m_r_pos < sizeof(m_buf)) {
		if (m_buf[m_r_pos++] == 0) {
			value.assign(p, &m_buf[m_r_pos - 1]);
			return;
		}
	}
	// crash in debug mode if no 0 in the packet
	assert(m_r_pos < sizeof(m_buf));
	value.assign(p, m_buf + m_r_pos);
}